

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cpp
# Opt level: O3

void __thiscall ncnn::Scale::Scale(Scale *this)

{
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Scale_0059d6b8;
  (this->bias_data).cstep = 0;
  (this->scale_data).data = (void *)0x0;
  (this->scale_data).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->scale_data).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->scale_data).elemsize + 4) = 0;
  (this->scale_data).allocator = (Allocator *)0x0;
  (this->scale_data).dims = 0;
  (this->scale_data).w = 0;
  (this->scale_data).w = 0;
  (this->scale_data).h = 0;
  (this->scale_data).d = 0;
  (this->scale_data).c = 0;
  (this->scale_data).cstep = 0;
  (this->bias_data).data = (void *)0x0;
  (this->bias_data).refcount = (int *)0x0;
  (this->bias_data).elemsize = 0;
  (this->bias_data).elempack = 0;
  (this->bias_data).allocator = (Allocator *)0x0;
  (this->bias_data).dims = 0;
  (this->bias_data).w = 0;
  (this->bias_data).w = 0;
  (this->bias_data).h = 0;
  (this->bias_data).d = 0;
  (this->bias_data).c = 0;
  (this->super_Layer).one_blob_only = true;
  (this->super_Layer).support_inplace = true;
  return;
}

Assistant:

Scale::Scale()
{
    one_blob_only = true;
    support_inplace = true;
}